

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O2

void __thiscall Am_Object_Data::demon_removal(Am_Object_Data *this)

{
  uint *puVar1;
  ushort uVar2;
  Am_Object_Demon *pAVar3;
  Am_Object_Data *this_00;
  Am_Object_Data **ppAVar4;
  Am_Object local_20;
  Am_Object local_18;
  
  uVar2 = this->demons_active;
  this->demons_active = uVar2 & 0x7fff;
  puVar1 = &(this->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 + 1;
  local_18.data = this;
  Am_Demon_Queue::Delete(&this->demon_queue,&local_18);
  Am_Object::~Am_Object(&local_18);
  if (((short)uVar2 < 0) &&
     (pAVar3 = this->demon_set->destroy_demon, pAVar3 != (Am_Object_Demon *)0x0)) {
    puVar1 = &(this->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    local_20.data = this;
    (*pAVar3)((Am_Object_Data *)&local_20);
    Am_Object::~Am_Object(&local_20);
  }
  ppAVar4 = &this->first_part;
  while (this_00 = *ppAVar4, this_00 != (Am_Object_Data *)0x0) {
    demon_removal(this_00);
    ppAVar4 = &this_00->next_part;
  }
  return;
}

Assistant:

void
Am_Object_Data::demon_removal()
{
  bool active = (demons_active & DEMONS_ACTIVE) != 0;
  demons_active &= ~DEMONS_ACTIVE;
  Note_Reference();
  demon_queue.Delete(this);
  if (active && demon_set->destroy_demon) {
    Note_Reference();
    demon_set->destroy_demon(this);
  }
  Am_Object_Data *current;
  for (current = first_part; current != nullptr; current = current->next_part)
    current->demon_removal();
}